

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

bool __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::Contains
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,S2Cell *target)

{
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  Iterator *it;
  bool bVar1;
  bool bVar2;
  CellRelation CVar3;
  int iVar4;
  const_reference clipped;
  int s;
  uint n;
  S2Point local_50;
  S2CellId local_38;
  
  CVar3 = MutableS2ShapeIndex::Iterator::Locate(this->iter_,(S2CellId)(target->id_).id_);
  if (CVar3 == INDEXED) {
    local_38.id_ = (this->iter_->super_IteratorBase).id_.id_;
    bVar1 = S2CellId::contains(&local_38,(S2CellId)(target->id_).id_);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index_region.h"
                 ,0x104,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)local_50.c_[1],"Check failed: iter_.id().contains(target.id()) ");
      abort();
    }
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              (this->iter_->super_IteratorBase).cell_._M_b._M_p;
    for (n = 0; bVar1 = n < (*(uint *)&this_00->field_0x0 & 0xffffff), bVar1; n = n + 1) {
      clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (this_00,n);
      if ((this->iter_->super_IteratorBase).id_.id_ == (target->id_).id_) {
        if (*(int *)&clipped->field_0x4 == 1) {
          return bVar1;
        }
      }
      else {
        iVar4 = (**(code **)(*(long *)(((this->contains_query_).index_)->shapes_).
                                      super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[clipped->shape_id_].
                                      _M_t.
                                      super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>
                            + 0x20))();
        if ((iVar4 == 2) && (bVar2 = AnyEdgeIntersects(this,clipped,target), !bVar2)) {
          it = this->iter_;
          S2Cell::GetCenter(&local_50,target);
          bVar2 = S2ContainsPointQuery<MutableS2ShapeIndex>::ShapeContains
                            (&this->contains_query_,it,clipped,&local_50);
          if (bVar2) {
            return bVar1;
          }
        }
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::Contains(const S2Cell& target) const {
  S2ShapeIndex::CellRelation relation = iter_.Locate(target.id());

  // If the relation is DISJOINT, then "target" is not contained.  Similarly if
  // the relation is SUBDIVIDED then "target" is not contained, since index
  // cells are subdivided only if they (nearly) intersect too many edges.
  if (relation != S2ShapeIndex::INDEXED) return false;

  // Otherwise, the iterator points to an index cell containing "target".
  // If any shape contains the target cell, we return true.
  S2_DCHECK(iter_.id().contains(target.id()));
  const S2ShapeIndexCell& cell = iter_.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    // The shape contains the target cell iff the shape contains the cell
    // center and none of its edges intersects the (padded) cell interior.
    if (iter_.id() == target.id()) {
      if (clipped.num_edges() == 0 && clipped.contains_center()) return true;
    } else {
      // It is faster to call AnyEdgeIntersects() before Contains().
      if (index().shape(clipped.shape_id())->dimension() == 2 &&
          !AnyEdgeIntersects(clipped, target) &&
          contains_query_.ShapeContains(iter_, clipped, target.GetCenter())) {
        return true;
      }
    }
  }
  return false;
}